

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

char * allocate_padded_buffer(size_t length)

{
  int iVar1;
  char *in_RAX;
  char *padded_buffer;
  char *local_8;
  
  local_8 = in_RAX;
  iVar1 = posix_memalign(&local_8,0x40,length + 0x20);
  if (iVar1 != 0) {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char * allocate_padded_buffer(size_t length) {
    // we could do a simple malloc
    //return (char *) malloc(length + SIMDJSON_PADDING);
    // However, we might as well align to cache lines...
    char *padded_buffer;
    size_t totalpaddedlength = length + SIMDJSON_PADDING;
#ifdef _MSC_VER
	padded_buffer = (char*) _aligned_malloc(totalpaddedlength, 64);
#elif defined(__MINGW32__) || defined(__MINGW64__)
	padded_buffer = __mingw_aligned_malloc(totalpaddedlength, 64);
#else
    if (posix_memalign(reinterpret_cast<void **>(&padded_buffer), 64, totalpaddedlength) != 0) { return nullptr;
}
#endif
	return padded_buffer;
}